

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

bool Image_Function::IsBinary
               (Image *image,uint32_t startX,uint32_t startY,uint32_t width,uint32_t height)

{
  ulong uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,startX,startY,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  Histogram((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,image,startX,startY,
            width,height);
  uVar1 = 0;
  for (; local_48._M_impl.super__Vector_impl_data._M_start !=
         local_48._M_impl.super__Vector_impl_data._M_finish;
      local_48._M_impl.super__Vector_impl_data._M_start =
           local_48._M_impl.super__Vector_impl_data._M_start + 1) {
    uVar1 = (uVar1 + 1) - (ulong)(*local_48._M_impl.super__Vector_impl_data._M_start == 0);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return uVar1 < 3;
}

Assistant:

bool IsBinary( const Image & image, uint32_t startX, uint32_t startY, uint32_t width, uint32_t height )
    {
        ParameterValidation( image, startX, startY, width, height );
        VerifyGrayScaleImage( image );

        const std::vector< uint32_t > histogram = Histogram( image, startX, startY, width, height );

        size_t counter = 0u;

        for( std::vector< uint32_t >::const_iterator value = histogram.begin(); value != histogram.end(); ++value ) {
            if( (*value) > 0u )
                ++counter;
        }

        return (counter < 3u);
    }